

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

istream * operator>>(istream *stream,ChunkHeader *header)

{
  pointer pMVar1;
  MaskRect *pMVar2;
  MaskRect *mask;
  pointer pMVar3;
  MaskRect *pMVar4;
  MaskRectRaw t_1;
  ChunkHeaderRaw h;
  MaskRect local_48;
  Type local_3c;
  ushort local_3a;
  ushort local_38;
  undefined8 local_36;
  uint16_t local_2e;
  uint32_t local_2c;
  
  std::istream::read((char *)stream,(long)&local_3c);
  header->type = local_3c;
  std::vector<MaskRect,_std::allocator<MaskRect>_>::resize(&header->masks,(ulong)local_3a);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::resize
            (&header->transparentMasks,(ulong)local_38);
  header->alignmentWords = (undefined2)local_36;
  header->x = local_36._2_2_;
  header->y = local_36._4_2_;
  header->w = local_36._6_2_;
  header->h = local_2e;
  header->size = local_2c;
  pMVar1 = (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar3 = (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    std::istream::read((char *)stream,(long)&local_48);
    *pMVar3 = local_48;
  }
  pMVar2 = (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar4 = (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar4 != pMVar2; pMVar4 = pMVar4 + 1) {
    std::istream::read((char *)stream,(long)&local_48);
    *pMVar4 = local_48;
  }
  std::istream::ignore((long)stream);
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, ChunkHeader& header) {
	auto h = readRaw<ChunkHeaderRaw>(stream);
	header.type = static_cast<ChunkHeader::Type>(h.type.value());
	header.masks.resize(h.masks.value());
	header.transparentMasks.resize(h.transparentMasks.value());
	header.alignmentWords = h.alignmentWords.value();
	header.x = h.x.value();
	header.y = h.y.value();
	header.w = h.w.value();
	header.h = h.h.value();
	header.size = h.size.value();
	for (auto& mask : header.masks) {
		mask = readRaw<MaskRectRaw>(stream);
	}
	for (auto& tmask : header.transparentMasks) {
		tmask = readRaw<MaskRectRaw>(stream);
	}
	stream.ignore(header.alignmentWords * 2);
	return stream;
}